

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall SoftHSM::C_Logout(SoftHSM *this,CK_SESSION_HANDLE hSession)

{
  Session *this_00;
  Token *pTVar1;
  Slot *this_01;
  Token *in_RDI;
  CK_SLOT_ID slotID;
  Token *token;
  Session *session;
  CK_SLOT_ID in_stack_00000038;
  HandleManager *in_stack_00000040;
  CK_SLOT_ID in_stack_00000048;
  SessionObjectStore *in_stack_00000050;
  CK_RV local_8;
  
  if ((in_RDI->valid & 1U) == 0) {
    local_8 = 400;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession((HandleManager *)session,(CK_SESSION_HANDLE)token);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      pTVar1 = Session::getToken(this_00);
      if (pTVar1 == (Token *)0x0) {
        local_8 = 5;
      }
      else {
        Token::logout(in_RDI);
        this_01 = Session::getSlot(this_00);
        Slot::getSlotID(this_01);
        HandleManager::tokenLoggedOut(in_stack_00000040,in_stack_00000038);
        SessionObjectStore::tokenLoggedOut(in_stack_00000050,in_stack_00000048);
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_Logout(CK_SESSION_HANDLE hSession)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Logout
	token->logout();

	// [PKCS#11 v2.40, C_Logout] When logout is successful...
	// a. Any of the application's handles to private objects become invalid.
	// b. Even if a user is later logged back into the token those handles remain invalid.
	// c. All private session objects from sessions belonging to the application are destroyed.

	// Have the handle manager remove all handles pointing to private objects for this slot.
	CK_SLOT_ID slotID = session->getSlot()->getSlotID();
	handleManager->tokenLoggedOut(slotID);
	sessionObjectStore->tokenLoggedOut(slotID);

	return CKR_OK;
}